

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Builder __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Data>
          (PointerBuilder *this,void *defaultValue,ByteCount defaultSize)

{
  word *pwVar1;
  BuilderArena *this_00;
  bool bVar2;
  SegmentBuilder *this_01;
  ulong uVar3;
  WirePointer *pWVar4;
  WirePointer *unaff_RBX;
  word *result;
  WirePointer *__dest;
  uint uVar5;
  WirePointer *ref;
  AllocateResult AVar6;
  Builder BVar7;
  ThrowOverflow local_42;
  anon_class_1_0_00000001 local_41;
  void *local_40;
  CapTableBuilder *local_38;
  
  ref = this->pointer;
  this_01 = this->segment;
  local_38 = this->capTable;
  if (0x1fffffff < defaultSize) {
    kj::ThrowOverflow::operator()(&local_42);
  }
  uVar5 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar5 != 0) {
    if ((uVar5 & 3) == 2) {
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar5 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar3 = (ulong)(uVar5 & 0xfffffff8);
      ref = (WirePointer *)((long)&pwVar1->content + uVar3);
      unaff_RBX = (WirePointer *)((long)&pwVar1[1].content + uVar3);
      if ((uVar5 & 4) == 0) {
        __dest = unaff_RBX + ((int)(ref->offsetAndKind).value >> 2);
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(ref->field_1).structRef);
        __dest = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((ref->offsetAndKind).value & 0xfffffff8));
        ref = unaff_RBX;
      }
    }
    else {
      __dest = ref + (long)((int)uVar5 >> 2) + 1;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    if (((ref->offsetAndKind).value & 3) == 1) {
      uVar5 = (ref->field_1).upper32Bits;
      unaff_RBX = (WirePointer *)(ulong)uVar5;
      if ((uVar5 & 7) != 2) {
        getBlob<capnp::Data>();
        goto LAB_0027bb4b;
      }
      unaff_RBX = (WirePointer *)(ulong)(uVar5 >> 3);
      bVar2 = false;
    }
    else {
      getBlob<capnp::Data>();
LAB_0027bb4b:
      bVar2 = true;
    }
    if (!bVar2) goto LAB_0027bb0e;
  }
  if (defaultSize == 0) {
    unaff_RBX = (WirePointer *)0x0;
    __dest = (WirePointer *)0x0;
  }
  else {
    uVar5 = defaultSize + 7 >> 3;
    local_40 = defaultValue;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,local_38,ref);
    }
    __dest = (WirePointer *)this_01->pos;
    if ((long)((long)(this_01->super_SegmentReader).ptr.ptr +
              ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
        (long)(ulong)uVar5) {
      __dest = (WirePointer *)0x0;
    }
    else {
      this_01->pos = (word *)(__dest + uVar5);
    }
    if (__dest == (WirePointer *)0x0) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      if (uVar5 == 0x1fffffff) {
        WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_41);
      }
      AVar6 = BuilderArena::allocate(this_00,uVar5 + 1);
      pWVar4 = (WirePointer *)AVar6.words;
      (ref->offsetAndKind).value =
           (int)AVar6.words - *(int *)&((AVar6.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar6.segment)->super_SegmentReader).id.value;
      (pWVar4->offsetAndKind).value = 1;
      __dest = pWVar4 + 1;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)__dest - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar4 = ref;
    }
    (pWVar4->field_1).upper32Bits = defaultSize * 8 + 2;
    unaff_RBX = (WirePointer *)(ulong)defaultSize;
    memcpy(__dest,local_40,(size_t)unaff_RBX);
  }
LAB_0027bb0e:
  BVar7.super_ArrayPtr<unsigned_char>.size_ = (size_t)unaff_RBX;
  BVar7.super_ArrayPtr<unsigned_char>.ptr = (uchar *)__dest;
  return (Builder)BVar7.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder PointerBuilder::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableDataPointer(pointer, segment, capTable, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}